

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver6L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *__return_storage_ptr__,
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                       *plPair,
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                      *lCPair)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  uint uVar7;
  reference pvVar8;
  Scalar *__x;
  Scalar *__y;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  complex<float> *this;
  float fVar12;
  float extraout_XMM0_Da;
  Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>
  PVar13;
  XprTypeNested XVar14;
  Type TStack_224b8;
  Type TStack_22480;
  non_const_type pMStack_22448;
  non_const_type pMStack_22440;
  Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>
  PStack_22438;
  XprTypeNested XStack_22428;
  Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>
  PStack_22418;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
  PStack_22400;
  ColXpr CStack_223e0;
  Type TStack_223b0;
  Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_22350;
  RowXpr RStack_222e8;
  ColXpr CStack_222b8;
  Type TStack_22288;
  ColXpr CStack_22228;
  Type TStack_221f8;
  TransposeReturnType TStack_22198;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
  PStack_22138;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_220d0;
  ColXpr CStack_22008;
  Type TStack_21fd8;
  ColXpr CStack_21f78;
  Type TStack_21f48;
  TransposeReturnType TStack_21ee8;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
  PStack_21e88;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_21e20;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
  CStack_21d58;
  NegativeReturnType NStack_21bc0;
  uint uStack_21a18;
  uint iter;
  non_const_type pMStack_219f0;
  complex<float> cStack_219e8;
  complex<float> temp;
  int r;
  Matrix<float,_3,_1,_0,_3,_1> solution;
  int c;
  bool isComplex;
  Matrix<std::complex<float>,_64,_64,_0,_64,_64> EV;
  EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> Eig;
  float d23;
  float d22;
  float d21;
  float d13;
  float d12;
  float d11;
  Matrix<float,_4,_4,_0,_4,_4> TransformationEstimate;
  undefined1 local_532c [8];
  Matrix<float,_3,_1,_0,_3,_1> TranslationEstimate;
  Matrix<float,_3,_3,_0,_3,_3> RotationEstimate;
  Matrix<float,_3,_1,_0,_3,_1> eD2;
  Matrix<float,_6,_1,_0,_6,_1> k;
  Matrix<float,_6,_3,_0,_6,_3> A;
  undefined1 local_5288 [8];
  Matrix<float,_64,_64,_0,_64,_64> Action;
  ColXpr local_1280;
  value_type local_1250;
  ColXpr local_1238;
  value_type local_1204;
  int local_11ec;
  undefined1 local_11e8 [4];
  int i;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L1vec;
  ColXpr local_1188;
  ColXpr local_1158;
  ColXpr local_1128;
  ColXpr local_10f8;
  ColXpr local_10c8;
  ColXpr local_1098;
  ColXpr local_1068;
  ColXpr local_1038;
  ColXpr local_1008;
  ColXpr local_fd8;
  ColXpr local_fa8;
  undefined1 local_f78 [8];
  Matrix<float,_6,_6,_0,_6,_6> L3;
  Matrix<float,_6,_6,_0,_6,_6> L2;
  Matrix<float,_6,_6,_0,_6,_6> L1;
  Type local_dc0;
  RealScalar local_d88;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_d84 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_d78;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_d60;
  Type local_d40;
  RealScalar local_d08;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_d04 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_cf8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_ce0;
  Type local_cc0;
  RealScalar local_c88;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_c84 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_c78;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_c60;
  Type local_c40;
  RealScalar local_c08;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_c04 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_bf8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_be0;
  Type local_bc0;
  RealScalar local_b88;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_b84 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_b78;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_b60;
  Type local_b40;
  RealScalar local_b08;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_b04 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_af8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_ae0;
  Type local_ac0;
  RealScalar local_a88;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a84 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_a78;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_a60;
  Type local_a40;
  RealScalar local_a08;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a04 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_9f8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_9e0;
  Type local_9c0;
  RealScalar local_988;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_984 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_978;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_960;
  Type local_940;
  RealScalar local_908;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_904 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_8f8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_8e0;
  Type local_8c0;
  RealScalar local_888;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_884 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_878;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_860;
  Type local_840;
  RealScalar local_808;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_804 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_7f8;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_7e0;
  undefined1 local_7c0 [8];
  Matrix<float,_6,_1,_0,_6,_1> L62;
  Matrix<float,_6,_1,_0,_6,_1> L61;
  Matrix<float,_6,_1,_0,_6,_1> L52;
  Matrix<float,_6,_1,_0,_6,_1> L51;
  Matrix<float,_6,_1,_0,_6,_1> L42;
  Matrix<float,_6,_1,_0,_6,_1> L41;
  Matrix<float,_6,_1,_0,_6,_1> L32;
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  Type local_668;
  Type local_630;
  Type local_5f8;
  Type local_5c0;
  Type local_588;
  Type local_550;
  Type local_518;
  Type local_4e0;
  Type local_4a8;
  Type local_470;
  Type local_438;
  Type local_400;
  Type local_3c8;
  Type local_390;
  Type local_358;
  Type local_320;
  Type local_2e8;
  Type local_2b0;
  Type local_278;
  Type local_240;
  Type local_208;
  Type local_1d0;
  Type local_198;
  undefined1 local_160 [8];
  Matrix<float,_3,_1,_0,_3,_1> R62_B;
  Matrix<float,_3,_1,_0,_3,_1> R61_B;
  Matrix<float,_3,_1,_0,_3,_1> Q62;
  Matrix<float,_3,_1,_0,_3,_1> Q61;
  Matrix<float,_3,_1,_0,_3,_1> R52_B;
  Matrix<float,_3,_1,_0,_3,_1> R51_B;
  Matrix<float,_3,_1,_0,_3,_1> Q52;
  Matrix<float,_3,_1,_0,_3,_1> Q51;
  Matrix<float,_3,_1,_0,_3,_1> R42_B;
  Matrix<float,_3,_1,_0,_3,_1> R41_B;
  Matrix<float,_3,_1,_0,_3,_1> Q42;
  Matrix<float,_3,_1,_0,_3,_1> Q41;
  Matrix<float,_3,_1,_0,_3,_1> R32_B;
  Matrix<float,_3,_1,_0,_3,_1> R31_B;
  Matrix<float,_3,_1,_0,_3,_1> Q32;
  Matrix<float,_3,_1,_0,_3,_1> Q31;
  Matrix<float,_3,_1,_0,_3,_1> R22_B;
  Matrix<float,_3,_1,_0,_3,_1> R21_B;
  Matrix<float,_3,_1,_0,_3,_1> Q22;
  Matrix<float,_3,_1,_0,_3,_1> Q21;
  Matrix<float,_3,_1,_0,_3,_1> R12_B;
  Matrix<float,_3,_1,_0,_3,_1> R11_B;
  Matrix<float,_3,_1,_0,_3,_1> Q12;
  undefined1 local_40 [8];
  Matrix<float,_3,_1,_0,_3,_1> Q11;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *solutions;
  
  Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._3_1_ =
       0;
  unique0x100062c6 = lCPair;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_40);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_160);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_198,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)local_40,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_198);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1d0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_1d0);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_208,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_208);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_240,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,
             3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_240);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_278,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_278);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_2b0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_2b0);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_2e8,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_2e8);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_320,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,
             3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_320);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_358,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_358);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_390,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_390);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_3c8,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_3c8);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_400,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,
             3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_400);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_438,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_438);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_470,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_470);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4a8,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_4a8);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4e0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,
             3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_4e0);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_518,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_518);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_550,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_550);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_588,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_588);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_5c0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,
             3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_5c0);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_5f8,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)pvVar8,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                  &local_5f8);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_630,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->first).second,3
            );
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_630);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_668,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&pvVar8->second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_668);
  pvVar8 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)(L11.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array + 4),
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(pvVar8->second).second,3);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)local_160,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             (L11.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_7c0);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_7f8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_40);
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_7e0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_7f8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_804,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_40);
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_7e0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_804);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_7e0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_840,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_808 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_840);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_808);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_878,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_860,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_878);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_884,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_860,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_884);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_860);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_8c0,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_888 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_8c0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_888);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_8f8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_8e0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_8f8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_904,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_8e0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_904);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_8e0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_940,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_908 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_940);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_908);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_978,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_960,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_978);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_984,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_960,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_984);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_960);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_9c0,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_988 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_9c0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_988);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_9f8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_9e0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_9f8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_a04,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_9e0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a04);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_9e0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_a40,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_a08 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_a40);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_a08);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_a78,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_a60,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_a78);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_a84,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_a60,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a84);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_a60);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_ac0,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_a88 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_ac0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_a88);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_af8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_ae0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_af8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_b04,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_ae0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_b04);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_ae0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_b40,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_b08 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_b40);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_b08);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_b78,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  (R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_b60,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_b78);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_b84,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_b60,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_b84);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_b60);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_bc0,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_b88 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_bc0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_b88);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_bf8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_be0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_bf8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_c04,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_be0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_c04);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_be0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_c40,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_c08 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_c40);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_c08);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_c78,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  (R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_c60,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_c78);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_c84,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_c60,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_c84);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_c60);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_cc0,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_c88 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_cc0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_c88);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_cf8,
             (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_ce0,
             (DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   *)&local_cf8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_d04,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_ce0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_d04);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_ce0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_d40,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),3);
  local_d08 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_d40);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),&local_d08);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_d78,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_160,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,6,1,0,6,1>>::operator<<
            (&local_d60,(DenseBase<Eigen::Matrix<float,6,1,0,6,1>> *)local_7c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&local_d78);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_d84,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&local_d60,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_d84);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_d60);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            (&local_dc0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_7c0,3);
  local_d88 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_dc0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_7c0,&local_d88);
  Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix
            ((Matrix<float,_6,_6,_0,_6,_6> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22));
  Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix
            ((Matrix<float,_6,_6,_0,_6,_6> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22));
  Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix((Matrix<float,_6,_6,_0,_6,_6> *)local_f78);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_fa8,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),0);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_fa8,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_fd8,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),0);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_fd8,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1008,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),1);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1008,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1038,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),1);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1038,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1068,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),2);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1068,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1098,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),2);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1098,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_10c8,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_10c8,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_10f8,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_10f8,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1128,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),4);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1128,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1158,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),4);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1158,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            (&local_1188,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),5);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)&local_1188,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4));
  Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
            ((ColXpr *)
             &L1vec.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x22),5);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true> *)
             &L1vec.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_7c0);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            *)&L2vec.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            *)local_11e8);
  for (local_11ec = 0; local_11ec < 6; local_11ec = local_11ec + 1) {
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
              (&local_1238,
               (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
               (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),(long)local_11ec);
    Eigen::Matrix<float,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>>
              ((Matrix<float,6,1,0,6,1> *)&local_1204,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               &local_1238);
    std::
    vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 *)&L2vec.
                    super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1204);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
              (&local_1280,
               (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
               (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),(long)local_11ec);
    Eigen::Matrix<float,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>>
              ((Matrix<float,6,1,0,6,1> *)&local_1250,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               &local_1280);
    std::
    vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 *)local_11e8,&local_1250);
  }
  Eigen::DenseBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::Zero();
  Eigen::Matrix<float,64,64,0,64,64>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,64,64,0,64,64>>>
            ((Matrix<float,64,64,0,64,64> *)local_5288,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>_>
              *)(A.super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.m_storage.m_data.
                 array + 0x10));
  setupAction<float>((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                      *)&L2vec.
                         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                      *)local_11e8,(Matrix<float,_64,_64,_0,_64,_64> *)local_5288);
  Eigen::Matrix<float,_6,_3,_0,_6,_3>::Matrix
            ((Matrix<float,_6,_3,_0,_6,_3> *)
             (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
             4));
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<float,_6,_1,_0,_6,_1> *)
             (eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (RotationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array + 7));
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_532c);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)((long)&d12 + 1),4,4);
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((Matrix<float,4,4,0,4,4> *)&d11,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)((long)&d12 + 1));
  Eigen::EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>::
  EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>
            ((EigenSolver<Eigen::Matrix<float,64,64,0,64,64>> *)
             (EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array + 0xfff),
             (EigenBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)local_5288,true);
  Eigen::EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::eigenvectors
            ((EigenvectorsType *)&c,
             (EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)
             (EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array + 0xfff));
  bVar6 = false;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::reserve(__return_storage_ptr__,0x40);
  for (solution.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] = 0.0;
      (int)solution.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] < 0x40;
      solution.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           = (float)((int)solution.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1] + 1)) {
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<float,_3,_1,_0,_3,_1> *)((long)&temp._M_value + 4));
    for (temp._M_value._0_4_ = 0; (int)temp._M_value < 3;
        temp._M_value._0_4_ = (int)temp._M_value + 1) {
      __x = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1> *)
                       &c,(long)((int)temp._M_value + 0x3c),
                       (long)(int)solution.
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1]);
      __y = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1> *)
                       &c,0x3f,(long)(int)solution.
                                          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[1]);
      std::operator/(__x,__y);
      fVar12 = std::complex<float>::real_abi_cxx11_(&cStack_219e8);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                          ((long)&temp._M_value + 4),(long)(int)temp._M_value);
      *pSVar9 = fVar12;
      this = &cStack_219e8;
      std::complex<float>::imag_abi_cxx11_(this);
      std::abs((int)this);
      if (1e-06 <= extraout_XMM0_Da) {
        bVar6 = true;
      }
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                          ((long)&temp._M_value + 4),(long)(int)temp._M_value);
      uVar7 = std::isnan((double)(ulong)(uint)*pSVar9);
      if ((uVar7 & 1) != 0) {
        bVar6 = true;
      }
    }
    if (bVar6) {
      bVar6 = false;
    }
    else {
      cayley2rot<float>((Matrix<float,_3,_3,_0,_3,_3> *)&stack0xfffffffffffde5ec,
                        (Matrix<float,_3,_1,_0,_3,_1> *)((long)&temp._M_value + 4));
      pMStack_219f0 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&stack0xfffffffffffde5ec);
      Eigen::Matrix<float,3,3,0,3,3>::operator=
                ((Matrix<float,3,3,0,3,3> *)
                 (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 1),
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_> *)
                 &pMStack_219f0);
      for (uStack_21a18 = 0; uStack_21a18 < 6; uStack_21a18 = uStack_21a18 + 1) {
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
                  (&CStack_21f78,
                   (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + 0x22),(ulong)uStack_21a18);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_21f48,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_21f78,3);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>
        ::transpose(&TStack_21ee8,
                    (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_21f48);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>>>
        ::operator*(&PStack_21e88,
                    (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>>
                     *)&TStack_21ee8,
                    (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                    (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     .m_storage.m_data.array + 1));
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
                  (&CStack_22008,
                   (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + 0x22),(ulong)uStack_21a18);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_21fd8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_22008,3);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>>
        ::operator*(&PStack_21e20,
                    (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>>
                     *)&PStack_21e88,
                    (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_21fd8);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
                  (&CStack_22228,
                   (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + 0x22),(ulong)uStack_21a18);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_221f8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_22228,3);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>
        ::transpose(&TStack_22198,
                    (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_221f8);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>>>
        ::operator*(&PStack_22138,
                    (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>>
                     *)&TStack_22198,
                    (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                    (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     .m_storage.m_data.array + 1));
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
                  (&CStack_222b8,
                   (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + 0x22),(ulong)uStack_21a18);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_22288,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_222b8,3);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>>
        ::operator*(&PStack_220d0,
                    (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>>
                     *)&PStack_22138,
                    (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_22288);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,-1,1,false>,0>>
        ::operator+(&CStack_21d58,
                    (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>,0>>
                     *)&PStack_21e20,
                    (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
                     *)&PStack_220d0);
        Eigen::
        DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>_>_>
        ::operator-(&NStack_21bc0,
                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>_>
                     *)&CStack_21d58);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::row
                  (&RStack_222e8,
                   (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                   (eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1),(ulong)uStack_21a18);
        Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,1,1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,1,0,6,1>,1,1,false> *)&RStack_222e8,
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>_>_>
                    *)&NStack_21bc0);
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)
                             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                              m_storage.m_data.array + 0x22),0,(ulong)uStack_21a18);
        fVar12 = *pSVar10;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)
                             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                              m_storage.m_data.array + 0x22),1,(ulong)uStack_21a18);
        fVar1 = *pSVar10;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)
                             (L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                              m_storage.m_data.array + 0x22),2,(ulong)uStack_21a18);
        fVar2 = *pSVar10;
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::col
                  (&CStack_223e0,
                   (DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + 0x22),(ulong)uStack_21a18);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_223b0,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_223e0,3);
        Eigen::MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator*
                  (&PStack_22350,
                   (MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)
                   (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + 1),
                   (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                    *)&TStack_223b0);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)
                   (RotationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + 7),
                   (DenseBase<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
                    *)&PStack_22350);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 7),0);
        fVar3 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 7),1);
        fVar4 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 7),2);
        fVar5 = *pSVar9;
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)
                             (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array + 4),(ulong)uStack_21a18,0);
        *pSVar11 = fVar2 * fVar4 - fVar1 * fVar5;
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)
                             (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array + 4),(ulong)uStack_21a18,1);
        *pSVar11 = fVar12 * fVar5 - fVar2 * fVar3;
        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)
                             (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array + 4),(ulong)uStack_21a18,2);
        *pSVar11 = fVar1 * fVar3 - fVar12 * fVar4;
      }
      pMStack_22440 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_> *)
                      (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4));
      PVar13 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>> *)
                          &pMStack_22440,
                          (MatrixBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_> *)
                          (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array + 4));
      PStack_22438 = PVar13;
      XVar14 = (XprTypeNested)
               Eigen::
               MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>
               ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>
                          *)&PStack_22438);
      XStack_22428 = XVar14;
      pMStack_22448 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_> *)
                      (k.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4));
      Eigen::
      MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>>
      ::operator*(&PStack_22418,
                  (MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>>
                   *)&XStack_22428,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>_> *)
                  &pMStack_22448);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,0>>
      ::operator*(&PStack_22400,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,0>>
                   *)&PStack_22418,
                  (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                  (eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)local_532c,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&PStack_22400);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&TStack_22480,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)&d11,3,3);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&TStack_22480,
                 (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                 (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                (&TStack_224b8,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)&d11,3,1);
      Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&TStack_224b8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_532c);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&d11);
    }
  }
  Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._3_1_ =
       1;
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)local_11e8);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)&L2vec.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
       _3_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}